

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

AST_Constant * get_constant_tree(token *constant)

{
  AST_Constant *pAVar1;
  AST_Constant *ret;
  token *constant_local;
  
  pAVar1 = (AST_Constant *)malloc(0x18);
  pAVar1->type = OP_CONSTANT;
  pAVar1->value = (void *)0x0;
  pAVar1->value_type = (Type *)0x0;
  free(constant);
  return pAVar1;
}

Assistant:

struct AST_Constant* get_constant_tree(struct token *constant)
{
	struct AST_Constant *ret;
	ret=malloc(sizeof(struct AST_Constant));
	ret->type=OP_CONSTANT;
	ret->value=NULL;
	ret->value_type=NULL;
	/*TODO*/

	free(constant);
	return ret;

}